

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O3

void renderTriangleScene(void)

{
  PFNGLDRAWARRAYSINSTANCEDPROC p_Var1;
  PFNGLUNIFORM2FPROC p_Var2;
  uint32_t uVar3;
  GLint GVar4;
  leb_Node node;
  
  (*glad_glViewport)(0x100,0,800,800);
  (*glad_glLineWidth)(1.0);
  (*glad_glUseProgram)(g_gl.programs[1]);
  (*glad_glBindVertexArray)(g_gl.vertexArray);
  p_Var1 = glad_glDrawArraysInstanced;
  node.depth = 0;
  node.id = (g_bintree.m_leb)->maxDepth;
  uVar3 = leb__HeapRead((leb_Heap *)(g_bintree.m_leb)->buffer,node);
  (*p_Var1)(4,0,3,uVar3);
  (*glad_glBindVertexArray)(0);
  (*glad_glViewport)(0x100,0,800,800);
  (*glad_glDisable)(0xb44);
  (*glad_glUseProgram)(g_gl.programs[0]);
  p_Var2 = glad_glUniform2f;
  GVar4 = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Target");
  (*p_Var2)(GVar4,g_params.target.x,g_params.target.y);
  (*glad_glPointSize)(11.0);
  (*glad_glBindVertexArray)(g_gl.vertexArray);
  (*glad_glDrawArrays)(0,0,1);
  (*glad_glBindVertexArray)(0);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void renderTriangleScene()
{
    // triangles
    glViewport(256, 0, VIEWPORT_WIDTH, VIEWPORT_WIDTH);
    glLineWidth(1.f);
    glUseProgram(g_gl.programs[PROGRAM_TRIANGLE]);
    glBindVertexArray(g_gl.vertexArray);
        glDrawArraysInstanced(GL_TRIANGLES, 0, 3, g_bintree.size());
    glBindVertexArray(0);

    // target helper
    glViewport(256, 0, VIEWPORT_WIDTH, VIEWPORT_WIDTH);
    glDisable(GL_CULL_FACE);
    glUseProgram(g_gl.programs[PROGRAM_POINT]);
    glUniform2f(
        glGetUniformLocation(g_gl.programs[PROGRAM_POINT], "u_Target"),
        g_params.target.x, g_params.target.y
    );
    glPointSize(11.f);
    glBindVertexArray(g_gl.vertexArray);
        glDrawArrays(GL_POINTS, 0, 1);
    glBindVertexArray(0);

    glUseProgram(0);
}